

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

RecyclableObject * Js::JavascriptOperators::ToObject(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  BOOL BVar3;
  RecyclableObject *local_28;
  RecyclableObject *object;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  local_28 = (RecyclableObject *)0x0;
  BVar3 = JavascriptConversion::ToObject(aRight,scriptContext,&local_28);
  if (BVar3 != 0) {
    pTVar2->noJsReentrancy = bVar1;
    return local_28;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,(PCWSTR)0x0);
}

Assistant:

RecyclableObject* JavascriptOperators::ToObject(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_ConvObject, reentrancylock, scriptContext->GetThreadContext());
        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptConversion::ToObject(aRight, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject /* TODO-ERROR: get arg name - aValue */);
        }

        return object;
        JIT_HELPER_END(Op_ConvObject);
    }